

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::XmlSerializer::ReadBaseMaterials(XmlSerializer *this)

{
  pointer ppaVar1;
  pointer ppaVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  iterator iVar6;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  _Base_ptr *__x;
  mapped_type *this_01;
  uint id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> MatIdArray;
  aiMaterial *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint local_24;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar4 = (*this->xmlReader->_vptr_IIrrXMLReader[7])
                    (this->xmlReader,XmlTag::basematerials_id_abi_cxx11_);
  if ((char *)CONCAT44(extraout_var,iVar4) != (char *)0x0) {
    uVar5 = atoi((char *)CONCAT44(extraout_var,iVar4));
    local_50 = (aiMaterial *)CONCAT44(local_50._4_4_,uVar5);
    ppaVar1 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppaVar2 = (this->mMatArray).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (uVar5 != this->mActiveMatGroup) {
      this->mActiveMatGroup = uVar5;
      iVar6 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::find(&(this->mMatId2MatArray)._M_t,(key_type *)&local_50);
      if (&(this->mMatId2MatArray)._M_t._M_impl.super__Rb_tree_header ==
          (_Rb_tree_header *)iVar6._M_node) {
        if (local_48._M_impl.super__Vector_impl_data._M_finish !=
            local_48._M_impl.super__Vector_impl_data._M_start) {
          local_48._M_impl.super__Vector_impl_data._M_finish =
               local_48._M_impl.super__Vector_impl_data._M_start;
        }
        this_00 = &std::
                   map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                   ::operator[](&this->mMatId2MatArray,(key_type *)&local_50)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
        __x = (_Base_ptr *)&local_48;
      }
      else {
        __x = &iVar6._M_node[1]._M_parent;
        this_00 = &local_48;
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x);
    }
    local_24 = (uint)((ulong)((long)ppaVar1 - (long)ppaVar2) >> 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_24);
    this_01 = std::
              map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->mMatId2MatArray,&this->mActiveMatGroup);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (this_01,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  }
  while( true ) {
    bVar3 = ReadToEndElement(this,(string *)XmlTag::basematerials_abi_cxx11_);
    if (!bVar3) break;
    local_50 = readMaterialDef(this);
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&this->mMatArray,&local_50);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ReadBaseMaterials() {
        std::vector<unsigned int> MatIdArray;
        const char *baseMaterialId( xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_id.c_str() ) );
        if ( nullptr != baseMaterialId ) {
            unsigned int id = std::atoi( baseMaterialId );
            const size_t newMatIdx( mMatArray.size() );
            if ( id != mActiveMatGroup ) {
                mActiveMatGroup = id;
                MatId2MatArray::const_iterator it( mMatId2MatArray.find( id ) );
                if ( mMatId2MatArray.end() == it ) {
                    MatIdArray.clear();
                    mMatId2MatArray[ id ] = MatIdArray;
                } else {
                    MatIdArray = it->second;
                }
            }
            MatIdArray.push_back( static_cast<unsigned int>( newMatIdx ) );
            mMatId2MatArray[ mActiveMatGroup ] = MatIdArray;
        }

        while ( ReadToEndElement( D3MF::XmlTag::basematerials ) ) {
            mMatArray.push_back( readMaterialDef() );
        }
    }